

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void loadCubemap(char *filename)

{
  stbi_uc *retval_from_stbi_load;
  ostream *poVar1;
  undefined8 uVar2;
  char *pcVar3;
  int iVar4;
  long lVar5;
  int c;
  int iVar6;
  bool bVar7;
  int bpp;
  int height;
  int width;
  
  retval_from_stbi_load = stbi_load(filename,&width,&height,&bpp,0);
  if (retval_from_stbi_load == (stbi_uc *)0x0) {
    poVar1 = std::operator<<((ostream *)&std::cout,"Failed to load image ");
    poVar1 = std::operator<<(poVar1,filename);
    poVar1 = std::operator<<(poVar1," (");
    pcVar3 = stbi_failure_reason();
    poVar1 = std::operator<<(poVar1,pcVar3);
    poVar1 = std::operator<<(poVar1,")");
LAB_0010f812:
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  else {
    poVar1 = std::operator<<((ostream *)&std::cout,"Loaded ");
    poVar1 = std::operator<<(poVar1,filename);
    poVar1 = std::operator<<(poVar1,", ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,height);
    poVar1 = std::operator<<(poVar1,'x');
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,width);
    poVar1 = std::operator<<(poVar1,", comp = ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,bpp);
    std::endl<char,std::char_traits<char>>(poVar1);
    lVar5 = 0;
    for (iVar6 = 0; iVar6 != 8; iVar6 = iVar6 + 1) {
      lVar5 = (long)(int)lVar5;
      iVar4 = 4;
      while (bVar7 = iVar4 != 0, iVar4 = iVar4 + -1, bVar7) {
        printf("%02d %02d %02d %02d  ",(ulong)retval_from_stbi_load[lVar5],
               (ulong)retval_from_stbi_load[lVar5 + 1],(ulong)retval_from_stbi_load[lVar5 + 2],
               (ulong)retval_from_stbi_load[lVar5 + 2]);
        lVar5 = lVar5 + 4;
      }
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    }
    poVar1 = std::operator<<((ostream *)&std::cout,"...");
    std::endl<char,std::char_traits<char>>(poVar1);
    if (bpp == 3) {
      uVar2 = 0x1907;
    }
    else {
      if (bpp != 4) {
        poVar1 = std::operator<<((ostream *)&std::cout,"Unsupported format: ");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,bpp);
        goto LAB_0010f812;
      }
      uVar2 = 0x1908;
    }
    glTexImage2D(0xde1,0,0x1907,width,height,0,uVar2,0x1401,retval_from_stbi_load);
    (*__glewGenerateMipmap)(0xde1);
    stbi_image_free(retval_from_stbi_load);
  }
  return;
}

Assistant:

void loadCubemap(const char *filename) {
    int width, height, bpp;
    unsigned char *pixels = stbi_load(filename, &width, &height, &bpp, STBI_default);
    if (pixels == nullptr) {
        cout << "Failed to load image " << filename << " (" << stbi_failure_reason() << ")" << endl;
        return;
    }
    cout << "Loaded " << filename << ", " << height << 'x' << width << ", comp = " << bpp << endl;
    int idx = 0;
    for (int c = 0; c < 8; c++) {
        for (int d = 0; d < 4; d++) {
            printf("%02d %02d %02d %02d  ", pixels[idx], pixels[idx+1], pixels[idx+2], pixels[idx+2]);
            idx += 4;
        }
        cout << endl;
    }
    cout << "..." << endl;

    GLenum format;
    switch(bpp) {
    case STBI_rgb:
        format = GL_RGB;
        break;
    case STBI_rgb_alpha:
        format = GL_RGBA;
        break;
    default:
        cout << "Unsupported format: " << bpp << endl;
        return;
    }

    glTexImage2D(GL_TEXTURE_2D, 0, GL_RGB, width, height, 0, format, GL_UNSIGNED_BYTE, pixels);
    glGenerateMipmap(GL_TEXTURE_2D);

    stbi_image_free(pixels);
}